

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_util.h
# Opt level: O0

void __thiscall cppcms::impl::shared_mutex::unlock(shared_mutex *this)

{
  int iVar1;
  int *piVar2;
  undefined8 *in_RDI;
  bool bVar3;
  flock lock;
  undefined2 local_28;
  undefined2 local_26;
  
  if (in_RDI[1] != 0) {
    memset(&local_28,0,0x20);
    local_28 = 2;
    local_26 = 0;
    do {
      iVar1 = fileno((FILE *)in_RDI[1]);
      iVar1 = fcntl(iVar1,7,&local_28);
      bVar3 = false;
      if (iVar1 != 0) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)*in_RDI);
  return;
}

Assistant:

void unlock()
		{
			if(flock_) {
				struct flock lock;
				memset(&lock,0,sizeof(lock));
				lock.l_type=F_UNLCK;
				lock.l_whence=SEEK_SET;
				while(::fcntl(fileno(flock_),F_SETLKW,&lock)!=0 && errno==EINTR)
					;
			}
			pthread_rwlock_unlock(plock_);
		}